

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall sf::Text::draw(Text *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  Transform *right;
  
  if (this->m_font != (Font *)0x0) {
    ensureGeometryUpdate(this);
    right = Transformable::getTransform(&this->super_Transformable);
    operator*=(&states.transform,right);
    states.texture = Font::getTexture(this->m_font,this->m_characterSize);
    if ((this->m_outlineThickness != 0.0) || (NAN(this->m_outlineThickness))) {
      bVar1 = VertexBuffer::isAvailable();
      if (bVar1) {
        RenderTarget::draw(target,&this->m_outlineVerticesBuffer,&states);
      }
      else {
        RenderTarget::draw(target,&(this->m_outlineVertices).super_Drawable,&states);
      }
    }
    bVar1 = VertexBuffer::isAvailable();
    if (bVar1) {
      RenderTarget::draw(target,&this->m_verticesBuffer,&states);
    }
    else {
      RenderTarget::draw(target,&(this->m_vertices).super_Drawable,&states);
    }
  }
  return;
}

Assistant:

void Text::draw(RenderTarget& target, RenderStates states) const
{
    if (m_font)
    {
        ensureGeometryUpdate();

        states.transform *= getTransform();
        states.texture = &m_font->getTexture(m_characterSize);

        // Only draw the outline if there is something to draw
        if (m_outlineThickness != 0)
        {
            if (VertexBuffer::isAvailable())
            {
                target.draw(m_outlineVerticesBuffer, states);
            }
            else
            {
                target.draw(m_outlineVertices, states);
            }
        }

        if (VertexBuffer::isAvailable())
        {
            target.draw(m_verticesBuffer, states);
        }
        else
        {
            target.draw(m_vertices, states);
        }
    }
}